

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

bool deqp::gles3::Functional::typeContainsMatchingBasicType
               (VarType *type,dataTypePredicate predicate)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  StructType *this;
  StructMember *this_00;
  VarType *pVVar4;
  int local_2c;
  int i;
  StructType *structType;
  dataTypePredicate predicate_local;
  VarType *type_local;
  
  bVar1 = glu::VarType::isBasicType(type);
  if (bVar1) {
    DVar2 = glu::VarType::getBasicType(type);
    type_local._7_1_ = (*predicate)(DVar2);
  }
  else {
    bVar1 = glu::VarType::isArrayType(type);
    if (bVar1) {
      pVVar4 = glu::VarType::getElementType(type);
      type_local._7_1_ = typeContainsMatchingBasicType(pVVar4,predicate);
    }
    else {
      this = glu::VarType::getStructPtr(type);
      for (local_2c = 0; iVar3 = glu::StructType::getNumMembers(this), local_2c < iVar3;
          local_2c = local_2c + 1) {
        this_00 = glu::StructType::getMember(this,local_2c);
        pVVar4 = glu::StructMember::getType(this_00);
        bVar1 = typeContainsMatchingBasicType(pVVar4,predicate);
        if (bVar1) {
          return true;
        }
      }
      type_local._7_1_ = false;
    }
  }
  return type_local._7_1_;
}

Assistant:

static bool typeContainsMatchingBasicType (const glu::VarType& type, const dataTypePredicate predicate)
{
	if (type.isBasicType())
		return predicate(type.getBasicType());
	else if (type.isArrayType())
		return typeContainsMatchingBasicType(type.getElementType(), predicate);
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		for (int i = 0; i < structType.getNumMembers(); i++)
			if (typeContainsMatchingBasicType(structType.getMember(i).getType(), predicate))
				return true;
		return false;
	}
}